

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int StopUBXThreadubloxx(UBLOX *publox)

{
  CRITICAL_SECTION *__mutex;
  long lVar1;
  
  __mutex = ubloxCS;
  lVar1 = 0;
  do {
    if (*(UBLOX **)((long)addrsublox + lVar1 * 2) == publox) {
      *(undefined4 *)((long)bExitUBXublox + lVar1) = 1;
      pthread_join(*(pthread_t *)((long)ubloxUBXThreadId + lVar1 * 2),(void **)0x0);
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      *(undefined4 *)((long)resublox + lVar1) = 1;
      return 0;
    }
    lVar1 = lVar1 + 4;
    __mutex = __mutex + 1;
  } while (lVar1 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StopUBXThreadubloxx(UBLOX* publox)
{
	int id = 0;

	while (addrsublox[id] != publox)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitUBXublox[id] = TRUE;
	WaitForThread(ubloxUBXThreadId[id]);
	DeleteCriticalSection(&ubloxCS[id]);
	resublox[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}